

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::level_formatter::format
          (level_formatter *this,log_msg *msg,tm *param_3,memory_buffer *dest)

{
  bool bVar1;
  string_view_t *psVar2;
  long in_RSI;
  memory_buffer *in_RDI;
  scoped_pad p;
  string_view_t *level_name;
  padding_info *in_stack_ffffffffffffff68;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  string_view_t in_stack_ffffffffffffff78;
  
  psVar2 = level::to_string_view(*(level_enum *)(in_RSI + 8));
  bVar1 = padding_info::enabled((padding_info *)&in_RDI->field_0x8);
  if (bVar1) {
    scoped_pad::scoped_pad
              ((scoped_pad *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff68,in_RDI);
    fmt_helper::append_string_view<500ul>(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    scoped_pad::~scoped_pad((scoped_pad *)in_RDI);
  }
  else {
    fmt_helper::append_string_view<500ul>
              (in_stack_ffffffffffffff78,
               (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)psVar2->size_);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t &level_name = level::to_string_view(msg.level);
        if (padinfo_.enabled())
        {
            scoped_pad p(level_name, padinfo_, dest);
            fmt_helper::append_string_view(level_name, dest);
        }
        else
        {
            fmt_helper::append_string_view(level_name, dest);
        }
    }